

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncoderVelocity.cpp
# Opt level: O3

double __thiscall EncoderVelocity::GetEncoderVelocity(EncoderVelocity *this)

{
  double dVar1;
  
  dVar1 = 0.0;
  if (((this->velOverflow == false) && (this->dirChange == false)) &&
     (dVar1 = 4.0 / ((double)(this->velPeriod + (uint)(this->velPeriod == 0)) * this->clkPeriod),
     this->velDir == false)) {
    dVar1 = -dVar1;
  }
  return dVar1;
}

Assistant:

double EncoderVelocity::GetEncoderVelocity() const
{
    uint32_t delta = 0;
    // Avoid divide by 0 (should never happen)
    if (velPeriod == 0) delta = 1;

    double vel = 0.0;
    if (!velOverflow && !dirChange) {
        vel = 4.0/((velPeriod+delta)*clkPeriod);
        if (!velDir)
            vel = -vel;
    }

    return vel;
}